

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O2

char * scp_source_err_base(ScpSource *scp,char *fmt,__va_list_tag *ap)

{
  SshChannel *pSVar1;
  char *__s;
  size_t sVar2;
  
  __s = dupvprintf(fmt,ap);
  pSVar1 = scp->sc;
  sVar2 = strlen(__s);
  (*pSVar1->vt->write)(pSVar1,true,__s,sVar2);
  (*scp->sc->vt->write)(scp->sc,true,"\n",1);
  return __s;
}

Assistant:

static char *scp_source_err_base(ScpSource *scp, const char *fmt, va_list ap)
{
    char *msg = dupvprintf(fmt, ap);
    sshfwd_write_ext(scp->sc, true, msg, strlen(msg));
    sshfwd_write_ext(scp->sc, true, "\012", 1);
    return msg;
}